

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# claim_strategy.h
# Opt level: O2

void __thiscall
disruptor::MultiThreadedStrategy::SynchronizePublishing
          (MultiThreadedStrategy *this,int64_t *sequence,Sequence *cursor,size_t *delta)

{
  long lVar1;
  size_t sVar2;
  
  lVar1 = *sequence;
  sVar2 = *delta;
  while ((cursor->sequence_).super___atomic_base<long>._M_i < (long)(lVar1 - sVar2)) {
    sched_yield();
  }
  (cursor->sequence_).super___atomic_base<long>._M_i = *sequence;
  return;
}

Assistant:

void SynchronizePublishing(const int64_t& sequence, Sequence& cursor,
                             const size_t& delta) {
    int64_t my_first_sequence = sequence - delta;

    while (cursor.sequence() < my_first_sequence) {
      // TODO: configurable yield strategy
      std::this_thread::yield();
    }

    cursor.set_sequence(sequence);
  }